

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QGenericArrayOps<QFileDialogPrivate::HistoryItem>::copyAppend
          (QGenericArrayOps<QFileDialogPrivate::HistoryItem> *this,HistoryItem *b,HistoryItem *e)

{
  qsizetype *pqVar1;
  HistoryItem *pHVar2;
  
  if (b != e) {
    pHVar2 = (this->super_QArrayDataPointer<QFileDialogPrivate::HistoryItem>).ptr;
    for (; b < e; b = b + 1) {
      QFileDialogPrivate::HistoryItem::HistoryItem
                (pHVar2 + (this->super_QArrayDataPointer<QFileDialogPrivate::HistoryItem>).size,b);
      pqVar1 = &(this->super_QArrayDataPointer<QFileDialogPrivate::HistoryItem>).size;
      *pqVar1 = *pqVar1 + 1;
    }
  }
  return;
}

Assistant:

void copyAppend(const T *b, const T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e) // short-cut and handling the case b and e == nullptr
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(*b);
            ++b;
            ++this->size;
        }
    }